

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

bool __thiscall
metaf::VisibilityGroup::appendRunway(VisibilityGroup *this,string *group,IncompleteText next)

{
  bool bVar1;
  Type TVar2;
  IncompleteText in_EDX;
  undefined8 in_RSI;
  VisibilityGroup *in_RDI;
  optional<metaf::Runway> oVar3;
  optional<metaf::Runway> r;
  undefined4 local_30;
  bool local_1;
  
  oVar3 = Runway::fromString((string *)in_RDI,SUB81((ulong)in_RSI >> 0x38,0));
  local_30 = CONCAT31(local_30._1_3_,
                      oVar3.super__Optional_base<metaf::Runway,_true,_true>._M_payload.
                      super__Optional_payload_base<metaf::Runway>._M_engaged);
  bVar1 = std::optional<metaf::Runway>::has_value((optional<metaf::Runway> *)0x244a10);
  if (bVar1) {
    (in_RDI->rw).super__Optional_base<metaf::Runway,_true,_true>._M_payload.
    super__Optional_payload_base<metaf::Runway>._M_payload =
         oVar3.super__Optional_base<metaf::Runway,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::Runway>._M_payload;
    *(undefined4 *)
     &(in_RDI->rw).super__Optional_base<metaf::Runway,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::Runway>._M_engaged = local_30;
    TVar2 = type(in_RDI);
    if (TVar2 == PREVAILING) {
      in_RDI->visType = RUNWAY;
    }
    TVar2 = type(in_RDI);
    if (TVar2 == VARIABLE_PREVAILING) {
      in_RDI->visType = VARIABLE_RUNWAY;
    }
    in_RDI->incompleteText = in_EDX;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool VisibilityGroup::appendRunway(const std::string & group, IncompleteText next) {
	const auto r = Runway::fromString(group, true);
	if (!r.has_value()) return false;
	rw = r;
	if (type() == Type::PREVAILING) visType = Type::RUNWAY;
	if (type() == Type::VARIABLE_PREVAILING) visType = Type::VARIABLE_RUNWAY;
	incompleteText = next;
	return true;
}